

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::TestCallHandler::encode
          (TestCallHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Reader value;
  Builder params;
  Builder call;
  StructBuilder local_c8;
  ListBuilder local_98;
  PointerBuilder local_68;
  StructBuilder local_48;
  
  *(undefined2 *)output._builder.data = 6;
  local_98.segment = output._builder.segment;
  local_98.capTable = output._builder.capTable;
  local_98.ptr = (byte *)output._builder.pointers;
  PointerBuilder::initStruct(&local_48,(PointerBuilder *)&local_98,(StructSize)0x20000);
  local_98.segment = local_48.segment;
  local_98.capTable = local_48.capTable;
  local_98.ptr = (byte *)local_48.pointers;
  value.super_StringPtr.content.size_ = 5;
  value.super_StringPtr.content.ptr = "Frob";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_98,value);
  local_c8.data = local_48.pointers + 1;
  local_c8.segment = local_48.segment;
  local_c8.capTable = local_48.capTable;
  PointerBuilder::initStructList(&local_98,(PointerBuilder *)&local_c8,2,(StructSize)0x10002);
  ListBuilder::getStructElement(&local_c8,&local_98,0);
  *(undefined2 *)&((WireValue<uint32_t>_conflict *)local_c8.data)->value = 2;
  ((WirePointer *)((long)local_c8.data + 8))->offsetAndKind = 0;
  ((WirePointer *)((long)local_c8.data + 8))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x405ec000;
  ListBuilder::getStructElement(&local_c8,&local_98,1);
  *(undefined2 *)&((WireValue<uint32_t>_conflict *)local_c8.data)->value = 3;
  local_68.segment = local_c8.segment;
  local_68.capTable = local_c8.capTable;
  local_68.pointer = local_c8.pointers;
  PointerBuilder::setBlob<capnp::Text>(&local_68,input);
  return;
}

Assistant:

void encode(const JsonCodec& codec, Text::Reader input,
              JsonValue::Builder output) const override {
    auto call = output.initCall();
    call.setFunction("Frob");
    auto params = call.initParams(2);
    params[0].setNumber(123);
    params[1].setString(input);
  }